

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::IObject> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IObject>::operator=
          (RefCntAutoPtr<Diligent::IObject> *this,IObject *pObj)

{
  IObject *pIVar1;
  
  pIVar1 = this->m_pObject;
  if (pIVar1 != pObj) {
    if (pIVar1 != (IObject *)0x0) {
      (*pIVar1->_vptr_IObject[2])();
    }
    this->m_pObject = pObj;
    if (pObj != (IObject *)0x0) {
      (*pObj->_vptr_IObject[1])(pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }